

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_pass.cc
# Opt level: O2

void __thiscall
init_pass(pybind11::module_&)::PyIRVisitor::visit(kratos::Generator__
          (void *this,Generator *generator)

{
  undefined1 local_38 [8];
  gil_scoped_acquire gil;
  Generator *generator_local;
  object o;
  function override;
  
  gil._8_8_ = generator;
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)local_38);
  pybind11::get_override<kratos::IRVisitor>((pybind11 *)&o,(IRVisitor *)this,"visit");
  if (o.super_handle.m_ptr != (PyObject *)0x0) {
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&generator_local,(Generator **)&o);
    pybind11::object::~object((object *)&generator_local);
  }
  pybind11::object::~object(&o);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)local_38);
  return;
}

Assistant:

void visit(Generator *generator) override {
            PYBIND11_OVERLOAD(void, IRVisitor, visit, generator);
        }